

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

QList<QTzType> *
parseTzTypes(QList<QTzType> *__return_storage_ptr__,QDataStream *ds,int tzh_typecnt)

{
  Status SVar1;
  QList<QTzType> *extraout_RAX;
  undefined4 extraout_var;
  pointer pQVar2;
  QList<QTzType> *pQVar3;
  QList<QTzType> *extraout_RAX_00;
  long lVar4;
  ulong size;
  undefined4 extraout_var_00;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (QTzType *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTzType>::QList(__return_storage_ptr__,(long)tzh_typecnt);
  pQVar3 = extraout_RAX;
  if (0 < tzh_typecnt) {
    lVar4 = 5;
    size = 0;
    do {
      SVar1 = QDataStream::status(ds);
      if (SVar1 != Ok) {
        return (QList<QTzType> *)CONCAT44(extraout_var,SVar1);
      }
      pQVar2 = QList<QTzType>::data(__return_storage_ptr__);
      QDataStream::operator>>(ds,(qint32 *)((long)pQVar2 + lVar4 + -5));
      SVar1 = QDataStream::status(ds);
      if (SVar1 == Ok) {
        QDataStream::operator>>(ds,(bool *)((long)pQVar2 + lVar4 + -1));
      }
      SVar1 = QDataStream::status(ds);
      if (SVar1 == Ok) {
        QDataStream::operator>>(ds,(qint8 *)((long)&pQVar2->tz_gmtoff + lVar4));
      }
      SVar1 = QDataStream::status(ds);
      pQVar3 = (QList<QTzType> *)CONCAT44(extraout_var_00,SVar1);
      if (SVar1 != Ok) {
        QList<QTzType>::resize(__return_storage_ptr__,size);
        pQVar3 = extraout_RAX_00;
      }
      size = size + 1;
      lVar4 = lVar4 + 8;
    } while ((uint)tzh_typecnt != size);
  }
  return pQVar3;
}

Assistant:

static QList<QTzType> parseTzTypes(QDataStream &ds, int tzh_typecnt)
{
    QList<QTzType> types(tzh_typecnt);

    // Parse tzh_typecnt x transition types
    for (int i = 0; i < tzh_typecnt && ds.status() == QDataStream::Ok; ++i) {
        QTzType &type = types[i];
        // Parse UTC Offset, 4 bytes
        ds >> type.tz_gmtoff;
        // Parse Is DST flag, 1 byte
        if (ds.status() == QDataStream::Ok)
            ds >> type.tz_isdst;
        // Parse Abbreviation Array Index, 1 byte
        if (ds.status() == QDataStream::Ok)
            ds >> type.tz_abbrind;
        if (ds.status() != QDataStream::Ok)
            types.resize(i);
    }

    return types;
}